

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_file.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::FileGenerator::GenerateBuildDescriptors
          (FileGenerator *this,Printer *printer)

{
  Options *options;
  string *psVar1;
  pointer ppEVar2;
  bool bVar3;
  size_t sVar4;
  FileDescriptor *pFVar5;
  pointer ppMVar6;
  ulong uVar7;
  pointer ppMVar8;
  unsigned_long i_00;
  unsigned_long i_01;
  int offset;
  int iVar9;
  char *pcVar10;
  pointer ppVar11;
  char *pcVar12;
  int i;
  ulong uVar13;
  long lVar14;
  size_t aux_offset;
  allocator<char> local_1da;
  allocator<char> local_1d9;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  pairs;
  string local_1a8;
  string local_188;
  vector<unsigned_long,_std::allocator<unsigned_long>_> aux_entries;
  vector<unsigned_long,_std::allocator<unsigned_long>_> entries;
  string local_128;
  size_t value;
  InternalMetadataWithArena local_100;
  
  io::Printer::Print(printer,
                     "PROTOBUF_CONSTEXPR_VAR ::google::protobuf::internal::ParseTableField\n    const TableStruct::entries[] = {\n"
                    );
  io::Printer::Indent(printer);
  entries.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  entries.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  entries.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  lVar14 = 0;
  for (uVar13 = 0;
      ppMVar6 = (this->message_generators_).
                super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
                ._M_impl.super__Vector_impl_data._M_start,
      uVar13 < (ulong)((long)(this->message_generators_).
                             super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)ppMVar6 >> 3);
      uVar13 = uVar13 + 1) {
    sVar4 = MessageGenerator::GenerateParseOffsets(ppMVar6[uVar13],printer);
    value = sVar4;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(&entries,&value);
    lVar14 = lVar14 + value;
  }
  if (lVar14 == 0) {
    io::Printer::Print(printer,"{0, 0, 0, ::google::protobuf::internal::kInvalidMask, 0, 0},\n");
  }
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,
                     "};\n\nPROTOBUF_CONSTEXPR_VAR ::google::protobuf::internal::AuxillaryParseTableField\n    const TableStruct::aux[] = {\n"
                    );
  io::Printer::Indent(printer);
  aux_entries.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  aux_entries.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  aux_entries.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  lVar14 = 0;
  for (uVar13 = 0;
      ppMVar6 = (this->message_generators_).
                super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
                ._M_impl.super__Vector_impl_data._M_start,
      uVar13 < (ulong)((long)(this->message_generators_).
                             super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)ppMVar6 >> 3);
      uVar13 = uVar13 + 1) {
    sVar4 = MessageGenerator::GenerateParseAuxTable(ppMVar6[uVar13],printer);
    value = sVar4;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(&aux_entries,&value);
    lVar14 = lVar14 + value;
  }
  if (lVar14 == 0) {
    io::Printer::Print(printer,"::google::protobuf::internal::AuxillaryParseTableField(),\n");
  }
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,
                     "};\nPROTOBUF_CONSTEXPR_VAR ::google::protobuf::internal::ParseTable const\n    TableStruct::schema[] = {\n"
                    );
  io::Printer::Indent(printer);
  uVar13 = 0;
  sVar4 = 0;
  aux_offset = 0;
  while( true ) {
    ppMVar6 = (this->message_generators_).
              super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppMVar8 = (this->message_generators_).
              super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if ((ulong)((long)ppMVar8 - (long)ppMVar6 >> 3) <= uVar13) break;
    MessageGenerator::GenerateParseTable(ppMVar6[uVar13],printer,sVar4,aux_offset);
    sVar4 = sVar4 + entries.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar13];
    aux_offset = aux_offset +
                 aux_entries.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar13];
    uVar13 = uVar13 + 1;
  }
  if (ppMVar6 == ppMVar8) {
    io::Printer::Print(printer,"{ NULL, NULL, 0, -1, -1, false },\n");
  }
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"};\n\n");
  options = &this->options_;
  if (((this->options_).enforce_lite == false) &&
     (*(int *)(*(long *)(this->file_ + 0xa0) + 0xa8) != 3)) {
    if ((this->message_generators_).
        super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (this->message_generators_).
        super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      io::Printer::Print(printer,
                         "const ::google::protobuf::uint32 TableStruct::offsets[] = { ~0u };\nstatic const ::google::protobuf::internal::MigrationSchema* schemas = NULL;\nstatic const ::google::protobuf::Message* const* file_default_instances = NULL;\n"
                        );
    }
    else {
      io::Printer::Print(printer,"const ::google::protobuf::uint32 TableStruct::offsets[] = {\n");
      io::Printer::Indent(printer);
      pairs.
      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pairs.
      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      pairs.
      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      for (uVar13 = 0;
          ppMVar6 = (this->message_generators_).
                    super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
          uVar13 < (ulong)((long)(this->message_generators_).
                                 super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)ppMVar6 >> 3);
          uVar13 = uVar13 + 1) {
        _value = MessageGenerator::GenerateOffsets(ppMVar6[uVar13],printer);
        std::
        vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
        ::emplace_back<std::pair<unsigned_long,unsigned_long>>
                  ((vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                    *)&pairs,(pair<unsigned_long,_unsigned_long> *)&value);
      }
      io::Printer::Outdent(printer);
      io::Printer::Print(printer,
                         "};\n\nstatic const ::google::protobuf::internal::MigrationSchema schemas[] = {\n"
                        );
      io::Printer::Indent(printer);
      lVar14 = 0;
      iVar9 = 0;
      for (uVar13 = 0;
          ppMVar6 = (this->message_generators_).
                    super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
          uVar13 < (ulong)((long)(this->message_generators_).
                                 super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)ppMVar6 >> 3);
          uVar13 = uVar13 + 1) {
        MessageGenerator::GenerateSchema
                  (ppMVar6[uVar13],printer,iVar9,
                   *(int *)((long)&(pairs.
                                    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->second + lVar14));
        iVar9 = iVar9 + *(int *)((long)&(pairs.
                                         super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->first + lVar14)
        ;
        lVar14 = lVar14 + 0x10;
      }
      io::Printer::Outdent(printer);
      io::Printer::Print(printer,
                         "};\n\nstatic ::google::protobuf::Message const * const file_default_instances[] = {\n"
                        );
      io::Printer::Indent(printer);
      uVar13 = 0;
      while( true ) {
        ppMVar6 = (this->message_generators_).
                  super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        uVar7 = (long)(this->message_generators_).
                      super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppMVar6 >> 3;
        if (uVar7 <= uVar13) break;
        ClassName_abi_cxx11_
                  ((string *)&value,(cpp *)ppMVar6[uVar13]->descriptor_,(Descriptor *)0x0,
                   SUB81(uVar7,0));
        io::Printer::Print(printer,
                           "reinterpret_cast<const ::google::protobuf::Message*>(&_$classname$_default_instance_),\n"
                           ,"classname",(string *)&value);
        std::__cxx11::string::~string((string *)&value);
        uVar13 = uVar13 + 1;
      }
      io::Printer::Outdent(printer);
      io::Printer::Print(printer,"};\n\n");
      std::
      _Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ::~_Vector_base(&pairs.
                       super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                     );
    }
    pcVar10 = "NULL";
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&value,"NULL",(allocator<char> *)&pairs);
    psVar1 = *(string **)this->file_;
    pcVar12 = "file_level_metadata";
    if ((this->message_generators_).
        super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (this->message_generators_).
        super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pcVar12 = "NULL";
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&pairs,pcVar12,(allocator<char> *)&local_128);
    pcVar12 = "file_level_enum_descriptors";
    if ((this->enum_generators_).
        super__Vector_base<google::protobuf::compiler::cpp::EnumGenerator_*,_std::allocator<google::protobuf::compiler::cpp::EnumGenerator_*>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (this->enum_generators_).
        super__Vector_base<google::protobuf::compiler::cpp::EnumGenerator_*,_std::allocator<google::protobuf::compiler::cpp::EnumGenerator_*>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pcVar12 = "NULL";
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a8,pcVar12,&local_1d9);
    bVar3 = HasGenericServices(this->file_,options);
    if ((bVar3) && (pcVar10 = "NULL", 0 < *(int *)(this->file_ + 0x78))) {
      pcVar10 = "file_level_service_descriptors";
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_188,pcVar10,&local_1da);
    io::Printer::Print(printer,
                       "namespace {\n\nvoid protobuf_AssignDescriptors() {\n  AddDescriptors();\n  ::google::protobuf::MessageFactory* factory = $factory$;\n  AssignDescriptors(\n      \"$filename$\", schemas, file_default_instances, TableStruct::offsets, factory,\n      $metadata$, $enum_descriptors$, $service_descriptors$);\n"
                       ,"filename",psVar1,"metadata",(string *)&pairs,"enum_descriptors",&local_1a8,
                       "service_descriptors",&local_188,"factory",(string *)&value);
    std::__cxx11::string::~string((string *)&local_188);
    std::__cxx11::string::~string((string *)&local_1a8);
    std::__cxx11::string::~string((string *)&pairs);
    uVar13 = 0;
    while( true ) {
      ppMVar6 = (this->message_generators_).
                super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppMVar8 = (this->message_generators_).
                super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      uVar7 = (long)ppMVar8 - (long)ppMVar6 >> 3;
      if (uVar7 <= uVar13) break;
      if (*(char *)(*(long *)(ppMVar6[uVar13]->descriptor_ + 0x20) + 0x6b) == '\x01') {
        SimpleItoa_abi_cxx11_((string *)&pairs,(protobuf *)(uVar13 & 0xffffffff),(int)uVar7);
        bVar3 = SUB81(ppMVar8,0);
        ClassName_abi_cxx11_
                  (&local_1a8,
                   *(cpp **)((this->message_generators_).
                             super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
                             ._M_impl.super__Vector_impl_data._M_start[uVar13]->descriptor_ + 0x18),
                   (Descriptor *)0x0,bVar3);
        ClassName_abi_cxx11_
                  (&local_188,
                   (cpp *)(this->message_generators_).
                          super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar13]->descriptor_,
                   (Descriptor *)0x0,bVar3);
        io::Printer::Print(printer,
                           "file_level_metadata[$index$].reflection = $parent$::$classname$::CreateReflection(file_level_metadata[$index$].descriptor, _$classname$_default_instance_.get_mutable());\n"
                           ,"index",(string *)&pairs,"parent",&local_1a8,"classname",&local_188);
        std::__cxx11::string::~string((string *)&local_188);
        std::__cxx11::string::~string((string *)&local_1a8);
        std::__cxx11::string::~string((string *)&pairs);
      }
      uVar13 = uVar13 + 1;
    }
    psVar1 = *(string **)this->file_;
    pcVar12 = "NULL";
    pcVar10 = "file_level_metadata";
    if (ppMVar6 == ppMVar8) {
      pcVar10 = "NULL";
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&pairs,pcVar10,(allocator<char> *)&local_128);
    pcVar10 = "file_level_enum_descriptors";
    if ((this->enum_generators_).
        super__Vector_base<google::protobuf::compiler::cpp::EnumGenerator_*,_std::allocator<google::protobuf::compiler::cpp::EnumGenerator_*>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (this->enum_generators_).
        super__Vector_base<google::protobuf::compiler::cpp::EnumGenerator_*,_std::allocator<google::protobuf::compiler::cpp::EnumGenerator_*>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pcVar10 = "NULL";
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a8,pcVar10,&local_1d9);
    bVar3 = HasGenericServices(this->file_,options);
    if ((bVar3) && (pcVar12 = "NULL", 0 < *(int *)(this->file_ + 0x78))) {
      pcVar12 = "file_level_service_descriptors";
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_188,pcVar12,&local_1da);
    io::Printer::Print(printer,
                       "}\n\nvoid protobuf_AssignDescriptorsOnce() {\n  static GOOGLE_PROTOBUF_DECLARE_ONCE(once);\n  ::google::protobuf::GoogleOnceInit(&once, &protobuf_AssignDescriptors);\n}\n\n"
                       ,"filename",psVar1,"metadata",(string *)&pairs,"enum_descriptors",&local_1a8,
                       "service_descriptors",&local_188,"factory",(string *)&value);
    std::__cxx11::string::~string((string *)&local_188);
    std::__cxx11::string::~string((string *)&local_1a8);
    std::__cxx11::string::~string((string *)&pairs);
    io::Printer::Print(printer,
                       "void protobuf_RegisterTypes(const ::std::string&) GOOGLE_ATTRIBUTE_COLD;\nvoid protobuf_RegisterTypes(const ::std::string&) {\n  protobuf_AssignDescriptorsOnce();\n"
                      );
    io::Printer::Indent(printer);
    ppMVar6 = (this->message_generators_).
              super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppMVar8 = (this->message_generators_).
              super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (ppMVar6 != ppMVar8) {
      SimpleItoa_abi_cxx11_((string *)&pairs,(protobuf *)((long)ppMVar8 - (long)ppMVar6 >> 3),i_00);
      io::Printer::Print(printer,
                         "::google::protobuf::internal::RegisterAllTypes(file_level_metadata, $size$);\n"
                         ,"size",(string *)&pairs);
      std::__cxx11::string::~string((string *)&pairs);
    }
    io::Printer::Outdent(printer);
    io::Printer::Print(printer,"}\n\n}  // namespace\n");
    std::__cxx11::string::~string((string *)&value);
  }
  io::Printer::Print(printer,"\nvoid TableStruct::Shutdown() {\n");
  io::Printer::Indent(printer);
  uVar13 = 0;
  while( true ) {
    ppMVar6 = (this->message_generators_).
              super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppMVar8 = (this->message_generators_).
              super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if ((ulong)((long)ppMVar8 - (long)ppMVar6 >> 3) <= uVar13) break;
    MessageGenerator::GenerateShutdownCode(ppMVar6[uVar13],printer);
    uVar13 = uVar13 + 1;
  }
  if (((this->options_).enforce_lite == false) &&
     (*(int *)(*(long *)(this->file_ + 0xa0) + 0xa8) != 3)) {
    for (uVar13 = 0; uVar13 < (ulong)((long)ppMVar8 - (long)ppMVar6 >> 3); uVar13 = uVar13 + 1) {
      if (*(char *)(*(long *)(ppMVar6[uVar13]->descriptor_ + 0x20) + 0x6b) == '\x01') {
        SimpleItoa_abi_cxx11_
                  ((string *)&value,(protobuf *)(uVar13 & 0xffffffff),
                   (int)*(long *)(ppMVar6[uVar13]->descriptor_ + 0x20));
        io::Printer::Print(printer,"delete file_level_metadata[$index$].reflection;\n","index",
                           (string *)&value);
        std::__cxx11::string::~string((string *)&value);
        ppMVar6 = (this->message_generators_).
                  super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ppMVar8 = (this->message_generators_).
                  super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
    }
  }
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"}\n\n");
  io::Printer::Print(printer,
                     "void TableStruct::InitDefaultsImpl() {\n  GOOGLE_PROTOBUF_VERIFY_VERSION;\n\n  ::google::protobuf::internal::InitProtobufDefaults();\n"
                    );
  io::Printer::Indent(printer);
  for (iVar9 = 0; iVar9 < *(int *)(this->file_ + 0x18); iVar9 = iVar9 + 1) {
    pFVar5 = FileDescriptor::dependency(this->file_,iVar9);
    psVar1 = *(string **)(pFVar5 + 8);
    FileLevelNamespace((string *)&pairs,*(string **)pFVar5);
    QualifiedFileLevelSymbol((string *)&value,psVar1,(string *)&pairs);
    std::__cxx11::string::~string((string *)&pairs);
    io::Printer::Print(printer,"$file_namespace$::InitDefaults();\n","file_namespace",
                       (string *)&value);
    std::__cxx11::string::~string((string *)&value);
  }
  for (uVar13 = 0;
      ppMVar6 = (this->message_generators_).
                super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
                ._M_impl.super__Vector_impl_data._M_start,
      uVar13 < (ulong)((long)(this->message_generators_).
                             super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)ppMVar6 >> 3);
      uVar13 = uVar13 + 1) {
    MessageGenerator::GenerateDefaultInstanceAllocator(ppMVar6[uVar13],printer);
  }
  for (uVar13 = 0;
      ppEVar2 = (this->extension_generators_).
                super__Vector_base<google::protobuf::compiler::cpp::ExtensionGenerator_*,_std::allocator<google::protobuf::compiler::cpp::ExtensionGenerator_*>_>
                ._M_impl.super__Vector_impl_data._M_start,
      uVar13 < (ulong)((long)(this->extension_generators_).
                             super__Vector_base<google::protobuf::compiler::cpp::ExtensionGenerator_*,_std::allocator<google::protobuf::compiler::cpp::ExtensionGenerator_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)ppEVar2 >> 3);
      uVar13 = uVar13 + 1) {
    ExtensionGenerator::GenerateRegistration(ppEVar2[uVar13],printer);
  }
  for (uVar13 = 0;
      ppMVar6 = (this->message_generators_).
                super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
                ._M_impl.super__Vector_impl_data._M_start,
      uVar13 < (ulong)((long)(this->message_generators_).
                             super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)ppMVar6 >> 3);
      uVar13 = uVar13 + 1) {
    MessageGenerator::GenerateDefaultInstanceInitializer(ppMVar6[uVar13],printer);
  }
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,
                     "}\n\nvoid InitDefaults() {\n  static GOOGLE_PROTOBUF_DECLARE_ONCE(once);\n  ::google::protobuf::GoogleOnceInit(&once, &TableStruct::InitDefaultsImpl);\n}\n"
                    );
  io::Printer::Print(printer,"void AddDescriptorsImpl() {\n  InitDefaults();\n");
  io::Printer::Indent(printer);
  if (((this->options_).enforce_lite == false) &&
     (*(int *)(*(long *)(this->file_ + 0xa0) + 0xa8) != 3)) {
    FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)&value);
    FileDescriptor::CopyTo(this->file_,(FileDescriptorProto *)&value);
    pairs.
    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)&pairs.
                   super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
    pairs.
    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    pairs.
    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)((ulong)pairs.
                          super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffffffffff00);
    MessageLite::SerializeToString((MessageLite *)&value,(string *)&pairs);
    io::Printer::Print(printer,"static const char descriptor[] = {\n");
    io::Printer::Indent(printer);
    if (pairs.
        super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_finish < (pointer)0x103e8) {
      for (ppVar11 = (pointer)0x0;
          ppVar11 < pairs.
                    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          ppVar11 = (pointer)&ppVar11[2].second) {
        std::__cxx11::string::substr((ulong)&local_128,(ulong)&pairs);
        CEscape(&local_188,&local_128);
        EscapeTrigraphs(&local_1a8,&local_188);
        io::Printer::Print(printer,"  \"$data$\"\n","data",&local_1a8);
        std::__cxx11::string::~string((string *)&local_1a8);
        std::__cxx11::string::~string((string *)&local_188);
        std::__cxx11::string::~string((string *)&local_128);
      }
    }
    else {
      iVar9 = 0;
      while (ppVar11 = (pointer)(long)iVar9,
            ppVar11 < pairs.
                      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish) {
        iVar9 = iVar9 + 0x19;
        for (; (pointer)(long)iVar9 != ppVar11; ppVar11 = (pointer)((long)&ppVar11->first + 1)) {
          if (pairs.
              super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
              ._M_impl.super__Vector_impl_data._M_finish <= ppVar11) {
            iVar9 = (int)ppVar11;
            break;
          }
          std::__cxx11::string::substr((ulong)&local_188,(ulong)&pairs);
          CEscape(&local_1a8,&local_188);
          io::Printer::Print(printer,"\'$char$\', ","char",&local_1a8);
          std::__cxx11::string::~string((string *)&local_1a8);
          std::__cxx11::string::~string((string *)&local_188);
        }
        io::Printer::Print(printer,"\n");
      }
    }
    io::Printer::Outdent(printer);
    io::Printer::Print(printer,"};\n");
    SimpleItoa_abi_cxx11_
              (&local_1a8,
               (protobuf *)
               pairs.
               super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,i_01);
    io::Printer::Print(printer,
                       "::google::protobuf::DescriptorPool::InternalAddGeneratedFile(\n    descriptor, $size$);\n"
                       ,"size",&local_1a8);
    std::__cxx11::string::~string((string *)&local_1a8);
    io::Printer::Print(printer,
                       "::google::protobuf::MessageFactory::InternalRegisterGeneratedFile(\n  \"$filename$\", &protobuf_RegisterTypes);\n"
                       ,"filename",*(string **)this->file_);
    std::__cxx11::string::~string((string *)&pairs);
    FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)&value);
  }
  for (iVar9 = 0; iVar9 < *(int *)(this->file_ + 0x18); iVar9 = iVar9 + 1) {
    pFVar5 = FileDescriptor::dependency(this->file_,iVar9);
    psVar1 = *(string **)(pFVar5 + 8);
    FileLevelNamespace((string *)&pairs,*(string **)pFVar5);
    QualifiedFileLevelSymbol((string *)&value,psVar1,(string *)&pairs);
    std::__cxx11::string::~string((string *)&pairs);
    io::Printer::Print(printer,"$file_namespace$::AddDescriptors();\n","file_namespace",
                       (string *)&value);
    std::__cxx11::string::~string((string *)&value);
  }
  io::Printer::Print(printer,"::google::protobuf::internal::OnShutdown(&TableStruct::Shutdown);\n");
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,
                     "}\n\nvoid AddDescriptors() {\n  static GOOGLE_PROTOBUF_DECLARE_ONCE(once);\n  ::google::protobuf::GoogleOnceInit(&once, &AddDescriptorsImpl);\n}\n"
                    );
  bVar3 = StaticInitializersForced(this->file_,options);
  if (!bVar3) {
    io::Printer::Print(printer,"#ifdef GOOGLE_PROTOBUF_NO_STATIC_INITIALIZER\n");
  }
  io::Printer::Print(printer,
                     "// Force AddDescriptors() to be called at static initialization time.\nstruct StaticDescriptorInitializer {\n  StaticDescriptorInitializer() {\n    AddDescriptors();\n  }\n} static_descriptor_initializer;\n"
                    );
  bVar3 = StaticInitializersForced(this->file_,options);
  if (!bVar3) {
    io::Printer::Print(printer,"#endif  // GOOGLE_PROTOBUF_NO_STATIC_INITIALIZER\n");
  }
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&aux_entries.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&entries.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  return;
}

Assistant:

void FileGenerator::GenerateBuildDescriptors(io::Printer* printer) {
  // AddDescriptors() is a file-level procedure which adds the encoded
  // FileDescriptorProto for this .proto file to the global DescriptorPool for
  // generated files (DescriptorPool::generated_pool()). It either runs at
  // static initialization time (by default) or when default_instance() is
  // called for the first time (in LITE_RUNTIME mode with
  // GOOGLE_PROTOBUF_NO_STATIC_INITIALIZER flag enabled). This procedure also
  // constructs default instances and registers extensions.
  //
  // Its sibling, AssignDescriptors(), actually pulls the compiled
  // FileDescriptor from the DescriptorPool and uses it to populate all of
  // the global variables which store pointers to the descriptor objects.
  // It also constructs the reflection objects.  It is called the first time
  // anyone calls descriptor() or GetReflection() on one of the types defined
  // in the file.

  // In optimize_for = LITE_RUNTIME mode, we don't generate AssignDescriptors()
  // and we only use AddDescriptors() to allocate default instances.

  // TODO(ckennelly): Gate this with the same options flag to enable
  // table-driven parsing.

  printer->Print("PROTOBUF_CONSTEXPR_VAR ::google::protobuf::internal::ParseTableField\n"
                 "    const TableStruct::entries[] = {\n");
  printer->Indent();

  std::vector<size_t> entries;
  size_t count = 0;
  for (int i = 0; i < message_generators_.size(); i++) {
    size_t value = message_generators_[i]->GenerateParseOffsets(printer);
    entries.push_back(value);
    count += value;
  }

  // We need these arrays to exist, and MSVC does not like empty arrays.
  if (count == 0) {
    printer->Print("{0, 0, 0, ::google::protobuf::internal::kInvalidMask, 0, 0},\n");
  }

  printer->Outdent();
  printer->Print(
      "};\n"
      "\n"
      "PROTOBUF_CONSTEXPR_VAR ::google::protobuf::internal::AuxillaryParseTableField\n"
      "    const TableStruct::aux[] = {\n");
  printer->Indent();

  std::vector<size_t> aux_entries;
  count = 0;
  for (int i = 0; i < message_generators_.size(); i++) {
    size_t value = message_generators_[i]->GenerateParseAuxTable(printer);
    aux_entries.push_back(value);
    count += value;
  }

  if (count == 0) {
    printer->Print("::google::protobuf::internal::AuxillaryParseTableField(),\n");
  }

  printer->Outdent();
  printer->Print(
      "};\n"
      "PROTOBUF_CONSTEXPR_VAR ::google::protobuf::internal::ParseTable const\n"
      "    TableStruct::schema[] = {\n");
  printer->Indent();

  size_t offset = 0;
  size_t aux_offset = 0;
  for (int i = 0; i < message_generators_.size(); i++) {
    message_generators_[i]->GenerateParseTable(printer, offset, aux_offset);
    offset += entries[i];
    aux_offset += aux_entries[i];
  }

  if (message_generators_.empty()) {
    printer->Print("{ NULL, NULL, 0, -1, -1, false },\n");
  }

  printer->Outdent();
  printer->Print(
      "};\n"
      "\n");

  if (HasDescriptorMethods(file_, options_)) {
    if (!message_generators_.empty()) {
      printer->Print("const ::google::protobuf::uint32 TableStruct::offsets[] = {\n");
      printer->Indent();
      std::vector<std::pair<size_t, size_t> > pairs;
      for (int i = 0; i < message_generators_.size(); i++) {
        pairs.push_back(message_generators_[i]->GenerateOffsets(printer));
      }
      printer->Outdent();
      printer->Print(
          "};\n"
          "\n"
          "static const ::google::protobuf::internal::MigrationSchema schemas[] = {\n");
      printer->Indent();
      {
        int offset = 0;
        for (int i = 0; i < message_generators_.size(); i++) {
          message_generators_[i]->GenerateSchema(printer, offset,
                                                 pairs[i].second);
          offset += pairs[i].first;
        }
      }
      printer->Outdent();
      printer->Print(
          "};\n"
          "\nstatic "
          "::google::protobuf::Message const * const file_default_instances[] = {\n");
      printer->Indent();
      for (int i = 0; i < message_generators_.size(); i++) {
        const Descriptor* descriptor = message_generators_[i]->descriptor_;
        printer->Print(
            "reinterpret_cast<const "
            "::google::protobuf::Message*>(&_$classname$_default_instance_),\n",
            "classname", ClassName(descriptor, false));
      }
      printer->Outdent();
      printer->Print(
          "};\n"
          "\n");
    } else {
      // we still need these symbols to exist
      printer->Print(
          // MSVC doesn't like empty arrays, so we add a dummy.
          "const ::google::protobuf::uint32 TableStruct::offsets[] = { ~0u };\n"
          "static const ::google::protobuf::internal::MigrationSchema* schemas = NULL;\n"
          "static const ::google::protobuf::Message* const* "
          "file_default_instances = NULL;\n");
    }

    // ---------------------------------------------------------------

    // protobuf_AssignDescriptorsOnce():  The first time it is called, calls
    // AssignDescriptors().  All later times, waits for the first call to
    // complete and then returns.
    string message_factory = "NULL";
    printer->Print(
        "namespace {\n"
        "\n"
        "void protobuf_AssignDescriptors() {\n"
        // Make sure the file has found its way into the pool.  If a descriptor
        // is requested *during* static init then AddDescriptors() may not have
        // been called yet, so we call it manually.  Note that it's fine if
        // AddDescriptors() is called multiple times.
        "  AddDescriptors();\n"
        "  ::google::protobuf::MessageFactory* factory = $factory$;\n"
        "  AssignDescriptors(\n"
        "      \"$filename$\", schemas, file_default_instances, "
        "TableStruct::offsets, factory,\n"
        "      $metadata$, $enum_descriptors$, $service_descriptors$);\n",
        "filename", file_->name(), "metadata",
        !message_generators_.empty() ? "file_level_metadata" : "NULL",
        "enum_descriptors",
        !enum_generators_.empty() ? "file_level_enum_descriptors" : "NULL",
        "service_descriptors",
        HasGenericServices(file_, options_) && file_->service_count() > 0
            ? "file_level_service_descriptors"
            : "NULL",
        "factory", message_factory);
    // TODO(gerbens) have the compiler include the schemas for map types
    // so that this can go away, and we can potentially use table driven
    // serialization for map types as well.
    for (int i = 0; i < message_generators_.size(); i++) {
      if (!IsMapEntryMessage(message_generators_[i]->descriptor_)) continue;
      printer->Print(
          "file_level_metadata[$index$].reflection = "
          "$parent$::$classname$::CreateReflection(file_level_metadata[$index$]"
          ".descriptor, _$classname$_default_instance_.get_mutable());\n",
          "index", SimpleItoa(i), "parent",
          ClassName(message_generators_[i]->descriptor_->containing_type(),
                    false),
          "classname", ClassName(message_generators_[i]->descriptor_, false));
    }
    printer->Print(
        "}\n"
        "\n"
        "void protobuf_AssignDescriptorsOnce() {\n"
        "  static GOOGLE_PROTOBUF_DECLARE_ONCE(once);\n"
        "  ::google::protobuf::GoogleOnceInit(&once, &protobuf_AssignDescriptors);\n"
        "}\n"
        "\n",
        "filename", file_->name(), "metadata",
        !message_generators_.empty() ? "file_level_metadata" : "NULL",
        "enum_descriptors",
        !enum_generators_.empty() ? "file_level_enum_descriptors" : "NULL",
        "service_descriptors",
        HasGenericServices(file_, options_) && file_->service_count() > 0
            ? "file_level_service_descriptors"
            : "NULL",
        "factory", message_factory);

    // Only here because of useless string reference that we don't want in
    // protobuf_AssignDescriptorsOnce, because that is called from all the
    // GetMetadata member methods.
    printer->Print(
        "void protobuf_RegisterTypes(const ::std::string&) GOOGLE_ATTRIBUTE_COLD;\n"
        "void protobuf_RegisterTypes(const ::std::string&) {\n"
        "  protobuf_AssignDescriptorsOnce();\n");
    printer->Indent();

    // All normal messages can be done generically
    if (!message_generators_.empty()) {
      printer->Print(
        "::google::protobuf::internal::RegisterAllTypes(file_level_metadata, $size$);\n",
        "size", SimpleItoa(message_generators_.size()));
    }

    printer->Outdent();
    printer->Print(
      "}\n"
      "\n"
      "}  // namespace\n");
  }

  // -----------------------------------------------------------------

  // ShutdownFile():  Deletes descriptors, default instances, etc. on shutdown.
  printer->Print(
    "\n"
    "void TableStruct::Shutdown() {\n");
  printer->Indent();

  for (int i = 0; i < message_generators_.size(); i++) {
    message_generators_[i]->GenerateShutdownCode(printer);
  }

  if (HasDescriptorMethods(file_, options_)) {
    for (int i = 0; i < message_generators_.size(); i++) {
      if (!IsMapEntryMessage(message_generators_[i]->descriptor_)) continue;
      printer->Print(
          "delete file_level_metadata[$index$].reflection;\n",
          "index", SimpleItoa(i));
    }
  }

  printer->Outdent();
  printer->Print(
    "}\n\n");

  // -----------------------------------------------------------------

  // Now generate the InitDefaultsImpl() function.
  printer->Print(
      "void TableStruct::InitDefaultsImpl() {\n"
      "  GOOGLE_PROTOBUF_VERIFY_VERSION;\n\n"
      // Force initialization of primitive values we depend on.
      "  ::google::protobuf::internal::InitProtobufDefaults();\n");

  printer->Indent();

  // Call the InitDefaults() methods for all of our dependencies, to make
  // sure they get added first.
  for (int i = 0; i < file_->dependency_count(); i++) {
    const FileDescriptor* dependency = file_->dependency(i);
    // Print the namespace prefix for the dependency.
    string file_namespace = QualifiedFileLevelSymbol(
        dependency->package(), FileLevelNamespace(dependency->name()));
    // Call its AddDescriptors function.
    printer->Print("$file_namespace$::InitDefaults();\n", "file_namespace",
                   file_namespace);
  }

  // Allocate and initialize default instances.  This can't be done lazily
  // since default instances are returned by simple accessors and are used with
  // extensions.  Speaking of which, we also register extensions at this time.
  for (int i = 0; i < message_generators_.size(); i++) {
    message_generators_[i]->GenerateDefaultInstanceAllocator(printer);
  }
  for (int i = 0; i < extension_generators_.size(); i++) {
    extension_generators_[i]->GenerateRegistration(printer);
  }
  for (int i = 0; i < message_generators_.size(); i++) {
    message_generators_[i]->GenerateDefaultInstanceInitializer(printer);
  }
  printer->Outdent();
  printer->Print(
      "}\n"
      "\n"
      "void InitDefaults() {\n"
      "  static GOOGLE_PROTOBUF_DECLARE_ONCE(once);\n"
      "  ::google::protobuf::GoogleOnceInit(&once, &TableStruct::InitDefaultsImpl);\n"
      "}\n");

  // -----------------------------------------------------------------

  // Now generate the AddDescriptors() function.
  printer->Print(
      "void AddDescriptorsImpl() {\n"
      "  InitDefaults();\n");

  printer->Indent();
  if (HasDescriptorMethods(file_, options_)) {
    // Embed the descriptor.  We simply serialize the entire
    // FileDescriptorProto
    // and embed it as a string literal, which is parsed and built into real
    // descriptors at initialization time.
    FileDescriptorProto file_proto;
    file_->CopyTo(&file_proto);
    string file_data;
    file_proto.SerializeToString(&file_data);

    printer->Print("static const char descriptor[] = {\n");
    printer->Indent();

    if (file_data.size() > 66535) {
      // Workaround for MSVC: "Error C1091: compiler limit: string exceeds 65535
      // bytes in length". Declare a static array of characters rather than use
      // a string literal. Only write 25 bytes per line.
      static const int kBytesPerLine = 25;
      for (int i = 0; i < file_data.size();) {
        for (int j = 0; j < kBytesPerLine && i < file_data.size(); ++i, ++j) {
          printer->Print("'$char$', ", "char",
                         CEscape(file_data.substr(i, 1)));
        }
        printer->Print("\n");
      }
    } else {
      // Only write 40 bytes per line.
      static const int kBytesPerLine = 40;
      for (int i = 0; i < file_data.size(); i += kBytesPerLine) {
        printer->Print("  \"$data$\"\n", "data",
                       EscapeTrigraphs(CEscape(
                           file_data.substr(i, kBytesPerLine))));
      }
    }

    printer->Outdent();
    printer->Print("};\n");
    printer->Print(
        "::google::protobuf::DescriptorPool::InternalAddGeneratedFile(\n"
        "    descriptor, $size$);\n",
        "size", SimpleItoa(file_data.size()));

    // Call MessageFactory::InternalRegisterGeneratedFile().
    printer->Print(
      "::google::protobuf::MessageFactory::InternalRegisterGeneratedFile(\n"
      "  \"$filename$\", &protobuf_RegisterTypes);\n",
      "filename", file_->name());
  }

  // Call the AddDescriptors() methods for all of our dependencies, to make
  // sure they get added first.
  for (int i = 0; i < file_->dependency_count(); i++) {
    const FileDescriptor* dependency = file_->dependency(i);
    // Print the namespace prefix for the dependency.
    string file_namespace = QualifiedFileLevelSymbol(
        dependency->package(), FileLevelNamespace(dependency->name()));
    // Call its AddDescriptors function.
    printer->Print("$file_namespace$::AddDescriptors();\n", "file_namespace",
                   file_namespace);
  }

  printer->Print(
      "::google::protobuf::internal::OnShutdown(&TableStruct::Shutdown);\n");

  printer->Outdent();
  printer->Print(
      "}\n"
      "\n"
      "void AddDescriptors() {\n"
      "  static GOOGLE_PROTOBUF_DECLARE_ONCE(once);\n"
      "  ::google::protobuf::GoogleOnceInit(&once, &AddDescriptorsImpl);\n"
      "}\n");

  if (!StaticInitializersForced(file_, options_)) {
    printer->Print("#ifdef GOOGLE_PROTOBUF_NO_STATIC_INITIALIZER\n");
  }
  printer->Print(
      // With static initializers.
      "// Force AddDescriptors() to be called at static initialization time.\n"
      "struct StaticDescriptorInitializer {\n"
      "  StaticDescriptorInitializer() {\n"
      "    AddDescriptors();\n"
      "  }\n"
      "} static_descriptor_initializer;\n");
  if (!StaticInitializersForced(file_, options_)) {
    printer->Print("#endif  // GOOGLE_PROTOBUF_NO_STATIC_INITIALIZER\n");
  }
}